

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRemote.cpp
# Opt level: O0

void __thiscall adios2::transport::FileRemote::Truncate(FileRemote *this,size_t length)

{
  string local_b8 [39];
  allocator local_91;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Toolkit",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,"transport::file::FileRemote",(allocator *)&stack0xffffffffffffff97);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff70,"Truncate",&local_91);
  std::operator+((char *)in_stack_ffffffffffffff78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  helper::Throw<std::ios_base::failure[abi:cxx11]>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void FileRemote::Truncate(const size_t length)
{
    helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileRemote", "Truncate",
                                          "does not support truncating " + m_Name);
}